

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall skiwi::anon_unknown_23::make_port3_test::test(make_port3_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_R8D;
  int iVar2;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  compile_fixture::build_libs(&this->super_compile_fixture);
  paVar1 = &local_7f0.field_2;
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(port? standard-input-port)","");
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_7f0,true,in_R8D);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf58,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(input-port? standard-input-port)","");
  compile_fixture::run(&local_50,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf59,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(output-port? standard-input-port)","");
  compile_fixture::run(&local_70,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(port? standard-output-port)","");
  compile_fixture::run(&local_90,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(input-port? standard-output-port)","");
  compile_fixture::run(&local_b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(output-port? standard-output-port)","");
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(port? standard-error-port)","");
  compile_fixture::run(&local_f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(input-port? standard-error-port)","");
  compile_fixture::run(&local_110,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_110,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(output-port? standard-error-port)","");
  compile_fixture::run(&local_130,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf60,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,
             "(define alternative-output-port (make-port #f \"altout\" 1 (make-string 1024) 0 1024))"
             ,"");
  compile_fixture::run(&local_150,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_150,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf62,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(current-output-port)","");
  compile_fixture::run(&local_170,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stdout\"",&local_170,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf64,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(current-output-port alternative-output-port)","");
  compile_fixture::run(&local_190,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf65,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(current-output-port)","");
  compile_fixture::run(&local_1b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf66,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(current-input-port)","");
  compile_fixture::run(&local_1d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stdin\"",&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf67,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(current-error-port)","");
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stderr\"",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf68,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,
             "(write-char #\\f)(write-char #\\l)(write-char #\\u)(write-char #\\s)(write-char #\\h)(write-char #\\010)"
             ,"");
  compile_fixture::run(&local_210,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(flush-output-port)","");
  compile_fixture::run(&local_230,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(open-file \"out.txt\" #f)","");
  compile_fixture::run(&local_250,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(close-file 3)","");
  compile_fixture::run(&local_270,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_270,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(define my_file (open-output-file \"out.txt\"))","");
  compile_fixture::run(&local_290,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_290,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf70,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(%slot-ref my_file 2)","");
  compile_fixture::run(&local_2b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf71,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(write-char #\\o my_file)","");
  compile_fixture::run(&local_2d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_2d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf72,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(write-char #\\u my_file)","");
  compile_fixture::run(&local_2f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_2f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf73,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(write-char #\\t my_file)","");
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf74,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(write-char #\\p my_file)","");
  compile_fixture::run(&local_330,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_330,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf75,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(write-char #\\u my_file)","");
  compile_fixture::run(&local_350,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_350,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf76,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(write-char #\\t my_file)","");
  compile_fixture::run(&local_370,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_370,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf77,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(close-output-port my_file)","");
  compile_fixture::run(&local_390,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_390,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf78,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(close-output-port my_file)","");
  compile_fixture::run(&local_3b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_3b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf79,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(define my_file (open-input-file \"out.txt\"))","");
  compile_fixture::run(&local_3d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_3d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(input-port? my_file)","");
  compile_fixture::run(&local_3f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_410,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\o",&local_410,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_450,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_450,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_470,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_470,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf80,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_490,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_490,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf81,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_4b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_4b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf82,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_4d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_4d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf83,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_4f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_4f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf84,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(close-input-port my_file)","");
  compile_fixture::run(&local_510,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_510,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf85,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(close-input-port my_file)","");
  compile_fixture::run(&local_530,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_530,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf86,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,
             "(set! my_file (let ([fh (open-file \"out.txt\" #t)])(make-port #t \"out.txt\" fh (make-string 3) 3 3)))"
             ,"");
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf88,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(%slot-ref my_file 5)","");
  compile_fixture::run(&local_570,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_570,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf89,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(input-port? my_file)","");
  compile_fixture::run(&local_590,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_590,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_5b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\o",&local_5b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_5d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_5d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_5f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_5f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_610,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_610,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_630,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_630,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_650,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_650,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf90,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf91,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_690,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_690,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf92,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_6b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_6b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf93,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_6d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_6d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf94,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_6f0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_6f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf95,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_710,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_710,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf96,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(peek-char my_file)","");
  compile_fixture::run(&local_730,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_730,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf97,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_750,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_750,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf98,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(read-char my_file)","");
  compile_fixture::run(&local_770,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_770,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf99,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(eof-object? (read-char my_file))","");
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f0,"(close-input-port my_file)","");
  compile_fixture::run(&local_7b0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  iVar2 = 0x1ff23d;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_7b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  local_7f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"(eof-object? 3)","");
  compile_fixture::run(&local_7d0,&this->super_compile_fixture,&local_7f0,true,iVar2);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_7d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test()
      {
      build_libs();
      TEST_EQ("#t", run("(port? standard-input-port)"));
      TEST_EQ("#t", run("(input-port? standard-input-port)"));
      TEST_EQ("#f", run("(output-port? standard-input-port)"));
      TEST_EQ("#t", run("(port? standard-output-port)"));
      TEST_EQ("#f", run("(input-port? standard-output-port)"));
      TEST_EQ("#t", run("(output-port? standard-output-port)"));
      TEST_EQ("#t", run("(port? standard-error-port)"));
      TEST_EQ("#f", run("(input-port? standard-error-port)"));
      TEST_EQ("#t", run("(output-port? standard-error-port)"));

      TEST_EQ("<port>: \"altout\"", run("(define alternative-output-port (make-port #f \"altout\" 1 (make-string 1024) 0 1024))"));

      TEST_EQ("<port>: \"stdout\"", run("(current-output-port)"));
      TEST_EQ("<port>: \"altout\"", run("(current-output-port alternative-output-port)"));
      TEST_EQ("<port>: \"altout\"", run("(current-output-port)"));
      TEST_EQ("<port>: \"stdin\"", run("(current-input-port)"));
      TEST_EQ("<port>: \"stderr\"", run("(current-error-port)"));

      TEST_EQ("", run("(write-char #\\f)(write-char #\\l)(write-char #\\u)(write-char #\\s)(write-char #\\h)(write-char #\\010)"));
      TEST_EQ("", run("(flush-output-port)"));

      TEST_EQ("3", run("(open-file \"out.txt\" #f)"));
      TEST_EQ("0", run("(close-file 3)"));

      TEST_EQ("<port>: \"out.txt\"", run("(define my_file (open-output-file \"out.txt\"))"));
      TEST_EQ("3", run("(%slot-ref my_file 2)")); // gets file handle id
      TEST_EQ("", run("(write-char #\\o my_file)"));
      TEST_EQ("", run("(write-char #\\u my_file)"));
      TEST_EQ("", run("(write-char #\\t my_file)"));
      TEST_EQ("", run("(write-char #\\p my_file)"));
      TEST_EQ("", run("(write-char #\\u my_file)"));
      TEST_EQ("", run("(write-char #\\t my_file)"));
      TEST_EQ("0", run("(close-output-port my_file)"));
      TEST_EQ("-1", run("(close-output-port my_file)"));

      TEST_EQ("<port>: \"out.txt\"", run("(define my_file (open-input-file \"out.txt\"))"));
      TEST_EQ("#t", run("(input-port? my_file)"));
      TEST_EQ("#\\o", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#\\p", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("0", run("(close-input-port my_file)"));
      TEST_EQ("-1", run("(close-input-port my_file)"));

      TEST_EQ("<port>: \"out.txt\"", run("(set! my_file (let ([fh (open-file \"out.txt\" #t)])(make-port #t \"out.txt\" fh (make-string 3) 3 3)))"));
      TEST_EQ("3", run("(%slot-ref my_file 5)")); // size of buffer
      TEST_EQ("#t", run("(input-port? my_file)"));
      TEST_EQ("#\\o", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(peek-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#\\p", run("(peek-char my_file)"));
      TEST_EQ("#\\p", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(peek-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(peek-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#t", run("(eof-object? (read-char my_file))"));
      TEST_EQ("0", run("(close-input-port my_file)"));
      TEST_EQ("#f", run("(eof-object? 3)"));
      }